

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

char16_t * __thiscall
Memory::AllocateArray<Memory::NoCheckHeapAllocator,char16_t,false>
          (Memory *this,NoCheckHeapAllocator *allocator,
          offset_in_NoCheckHeapAllocator_to_subr AllocFunc,size_t count)

{
  char16_t *pcVar1;
  size_t byteSize;
  size_t count_local;
  offset_in_NoCheckHeapAllocator_to_subr AllocFunc_local;
  NoCheckHeapAllocator *allocator_local;
  
  byteSize = count * 2;
  if (CARRY8(count,count)) {
    byteSize = 0xffffffffffffffff;
  }
  pcVar1 = (char16_t *)
           operator_new__(byteSize,(NoCheckHeapAllocator *)this,
                          (offset_in_NoCheckHeapAllocator_to_subr)allocator);
  return pcVar1;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}